

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::TransferSlotAfterSoo
          (HashSetResizeHelper *this,CommonFields *c,size_t slot_size)

{
  bool bVar1;
  size_t sVar2;
  void *pvVar3;
  void *__src;
  size_t slot_size_local;
  CommonFields *c_local;
  HashSetResizeHelper *this_local;
  
  if ((this->was_soo_ & 1U) == 0) {
    __assert_fail("was_soo_",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x205,
                  "void absl::container_internal::HashSetResizeHelper::TransferSlotAfterSoo(CommonFields &, size_t)"
                 );
  }
  if ((this->had_soo_slot_ & 1U) != 0) {
    sVar2 = CommonFields::capacity(c);
    bVar1 = is_single_group(sVar2);
    if (!bVar1) {
      __assert_fail("is_single_group(c.capacity())",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                    ,0x207,
                    "void absl::container_internal::HashSetResizeHelper::TransferSlotAfterSoo(CommonFields &, size_t)"
                   );
    }
    pvVar3 = CommonFields::slot_array(c);
    sVar2 = SooSlotIndex();
    pvVar3 = SlotAddress(pvVar3,sVar2,slot_size);
    __src = old_soo_data(this);
    memcpy(pvVar3,__src,slot_size);
    PoisonSingleGroupEmptySlots(this,c,slot_size);
    return;
  }
  __assert_fail("had_soo_slot_",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0x206,
                "void absl::container_internal::HashSetResizeHelper::TransferSlotAfterSoo(CommonFields &, size_t)"
               );
}

Assistant:

void HashSetResizeHelper::TransferSlotAfterSoo(CommonFields& c,
                                               size_t slot_size) {
  assert(was_soo_);
  assert(had_soo_slot_);
  assert(is_single_group(c.capacity()));
  std::memcpy(SlotAddress(c.slot_array(), SooSlotIndex(), slot_size),
              old_soo_data(), slot_size);
  PoisonSingleGroupEmptySlots(c, slot_size);
}